

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenSIMDLoadStoreLane
          (BinaryenModuleRef module,BinaryenOp op,uint32_t offset,uint32_t align,uint8_t index,
          BinaryenExpressionRef ptr,BinaryenExpressionRef vec,char *memoryName)

{
  BinaryenExpressionRef ptr_00;
  uint8_t index_00;
  uint32_t op_00;
  SIMDLoadStoreLane *pSVar1;
  Name memory;
  Address local_40;
  Address local_38;
  Builder local_30;
  BinaryenExpressionRef local_28;
  BinaryenExpressionRef ptr_local;
  uint32_t uStack_18;
  uint8_t index_local;
  uint32_t align_local;
  uint32_t offset_local;
  BinaryenOp op_local;
  BinaryenModuleRef module_local;
  
  local_28 = ptr;
  ptr_local._3_1_ = index;
  ptr_local._4_4_ = align;
  uStack_18 = offset;
  align_local = op;
  _offset_local = module;
  wasm::Builder::Builder(&local_30,module);
  op_00 = align_local;
  wasm::Address::Address(&local_38,(ulong)uStack_18);
  wasm::Address::Address(&local_40,(ulong)ptr_local._4_4_);
  index_00 = ptr_local._3_1_;
  ptr_00 = local_28;
  memory = getMemoryName(_offset_local,memoryName);
  pSVar1 = wasm::Builder::makeSIMDLoadStoreLane
                     (&local_30,op_00,local_38,local_40,index_00,ptr_00,vec,memory);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDLoadStoreLane(BinaryenModuleRef module,
                                                BinaryenOp op,
                                                uint32_t offset,
                                                uint32_t align,
                                                uint8_t index,
                                                BinaryenExpressionRef ptr,
                                                BinaryenExpressionRef vec,
                                                const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDLoadStoreLane(SIMDLoadStoreLaneOp(op),
                             Address(offset),
                             Address(align),
                             index,
                             (Expression*)ptr,
                             (Expression*)vec,
                             getMemoryName(module, memoryName)));
}